

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O0

void __thiscall CEffects::BulletTrail(CEffects *this,vec2 Pos)

{
  long lVar1;
  CParticle *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  CParticle p;
  CParticle *pCVar2;
  int Group;
  CParticles *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CParticles *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if ((in_RDI->m_Spr & 0x100) != 0) {
    pCVar2 = in_RDI;
    CParticle::CParticle(in_RDI);
    Group = (int)((ulong)pCVar2 >> 0x20);
    CParticle::SetDefault(in_RDI);
    random_float();
    CParticles::Add(this_00,Group,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEffects::BulletTrail(vec2 Pos)
{
	if(!m_Add100hz)
		return;

	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_BALL;
	p.m_Pos = Pos;
	p.m_LifeSpan = 0.25f + random_float()*0.25f;
	p.m_StartSize = 8.0f;
	p.m_EndSize = 0;
	p.m_Friction = 0.7f;
	m_pClient->m_pParticles->Add(CParticles::GROUP_PROJECTILE_TRAIL, &p);
}